

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall upb::generator::Output::Write(Output *this,string_view data)

{
  short *psVar1;
  ulong uVar2;
  ulong uVar3;
  string last_line_prefix;
  string stripped;
  long *local_d0;
  char local_c8 [8];
  long local_c0 [2];
  short *local_b0;
  ulong local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  long *local_90 [2];
  long local_80 [2];
  undefined1 local_70 [32];
  char local_50 [8];
  long *local_48;
  undefined8 local_40;
  char *local_38;
  
  psVar1 = (short *)data._M_str;
  uVar3 = data._M_len;
  local_a8 = 0;
  local_a0 = 0;
  local_b0 = (short *)&local_a0;
  if ((1 < uVar3) && (*psVar1 == 0x200a)) {
    uVar2 = 1;
    do {
      if (*(char *)((long)psVar1 + uVar2) != ' ') {
        if (uVar3 < uVar2) {
          uVar2 = uVar3;
        }
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,psVar1,(long)psVar1 + uVar2);
        std::__cxx11::string::resize((ulong)&local_d0,local_c8[0] + -2);
        local_70[0x10] = '\x01';
        local_70[0x11] = '\0';
        local_70[0x12] = '\0';
        local_70[0x13] = '\0';
        local_70[0x14] = '\0';
        local_70[0x15] = '\0';
        local_70[0x16] = '\0';
        local_70[0x17] = '\0';
        local_70._24_8_ = "\n";
        local_50[0] = local_c8[0];
        local_50[1] = local_c8[1];
        local_50[2] = local_c8[2];
        local_50[3] = local_c8[3];
        local_50[4] = local_c8[4];
        local_50[5] = local_c8[5];
        local_50[6] = local_c8[6];
        local_50[7] = local_c8[7];
        local_48 = local_d0;
        local_40 = 1;
        local_38 = "\n";
        local_70._0_8_ = uVar2;
        local_70._8_8_ = psVar1;
        absl::lts_20240722::StrReplaceAll_abi_cxx11_
                  (local_90,uVar3 - uVar2,(long)psVar1 + uVar2,local_70,2);
        std::__cxx11::string::operator=((string *)&local_b0,(string *)local_90);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        uVar3 = local_a8;
        psVar1 = local_b0;
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        break;
      }
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  local_70._0_8_ = uVar3;
  local_70._8_8_ = psVar1;
  absl::lts_20240722::StrAppend((string *)this,(AlphaNum *)local_70);
  if (local_b0 != (short *)&local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void Write(absl::string_view data) {
    std::string stripped;
    if (absl::StartsWith(data, "\n ")) {
      size_t indent = data.substr(1).find_first_not_of(' ');
      if (indent != absl::string_view::npos) {
        // Remove indentation from all lines.
        auto line_prefix = data.substr(0, indent + 1);
        // The final line has an extra newline and is indented two less, eg.
        //    R"cc(
        //      UPB_INLINE $0 $1_$2(const $1 *msg) {
        //        return $1_has_$2(msg) ? *UPB_PTR_AT(msg, $3, $0) : $4;
        //      }
        //    )cc",
        std::string last_line_prefix = std::string(line_prefix);
        last_line_prefix.resize(last_line_prefix.size() - 2);
        data.remove_prefix(line_prefix.size());
        stripped = absl::StrReplaceAll(
            data, {{line_prefix, "\n"}, {last_line_prefix, "\n"}});
        data = stripped;
      }
    }
    absl::StrAppend(&output_, data);
  }